

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O3

AddressFormatData *
cfd::core::AddressFormatData::ConvertFromJson
          (AddressFormatData *__return_storage_ptr__,string *json_data)

{
  pointer pcVar1;
  _Rb_tree_node_base *p_Var2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  CfdException *this;
  size_t in_RCX;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  json_map;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  prefix_map;
  size_t i;
  UniValue object;
  undefined1 local_f0 [32];
  _Rb_tree_node_base *local_d0;
  size_t local_c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  size_t local_90;
  UniValue local_88;
  
  local_88.val._M_dataplus._M_p = (pointer)&local_88.val.field_2;
  local_88.val._M_string_length = 0;
  local_88.val.field_2._M_local_buf[0] = '\0';
  local_88.typ = VNULL;
  local_88.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniValue::read(&local_88,(int)(json_data->_M_dataplus)._M_p,(void *)json_data->_M_string_length,
                 in_RCX);
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar1 = local_f0 + 0x10;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_88.typ == VOBJ) {
    local_f0._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"nettype","");
    bVar3 = UniValue::findKey(&local_88,(string *)local_f0,&local_90);
    if ((pointer)local_f0._0_8_ != pcVar1) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    if (bVar3) {
      p_Var2 = (_Rb_tree_node_base *)(local_f0 + 8);
      local_f0._8_4_ = _S_red;
      local_f0._16_8_ = 0;
      local_c8 = 0;
      local_f0._24_8_ = p_Var2;
      local_d0 = p_Var2;
      UniValue::getObjMap(&local_88,
                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                           *)local_f0);
      if ((_Rb_tree_node_base *)local_f0._24_8_ != p_Var2) {
        p_Var4 = (_Rb_tree_node_base *)local_f0._24_8_;
        do {
          if (p_Var4[2]._M_color == 3) {
            ::std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&local_c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var4 + 1),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &p_Var4[2]._M_parent);
          }
          p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4);
        } while (p_Var4 != p_Var2);
      }
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                   *)local_f0);
    }
    if (local_c0._M_impl.super__Rb_tree_header._M_node_count != 0) {
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)__return_storage_ptr__,&local_c0);
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_c0);
      UniValue::~UniValue(&local_88);
      return __return_storage_ptr__;
    }
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_f0._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"Invalid address prefix json data.","");
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_f0);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

AddressFormatData AddressFormatData::ConvertFromJson(
    const std::string& json_data) {
  UniValue object;
  object.read(json_data);
  std::map<std::string, std::string> prefix_map;
  if (object.isObject() && object.exists(kNettype)) {
    std::map<std::string, UniValue> json_map;
    object.getObjMap(json_map);
    for (const auto& child : json_map) {
      if (child.second.isStr()) {
        prefix_map.emplace(child.first, child.second.getValStr());
      }
    }
  }
  if (prefix_map.empty() || (prefix_map.size() == 0)) {
    throw CfdException(
        kCfdIllegalArgumentError, "Invalid address prefix json data.");
  }
  AddressFormatData result(prefix_map);
  return result;
}